

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdDecompose_rec
               (Kit_DsdNtk_t *pNtk,Kit_DsdObj_t *pObj,uint uSupp,unsigned_short *pPar,int nDecMux)

{
  ushort uVar1;
  undefined2 uVar2;
  Kit_DsdObj_t KVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint *pTruth_00;
  uint *pCof1;
  uint *pOut;
  uint *pOut_00;
  uint *pOut_01;
  Kit_DsdObj_t *pKVar13;
  Kit_DsdObj_t *pKVar14;
  uint *puVar15;
  uint *puVar16;
  int iBestVar;
  uint uSupp1;
  uint uSupp0;
  uint nFansNew;
  uint k;
  uint j;
  int fPairs [4] [4];
  int fOppos;
  int fEquals [2] [2];
  int nPairs;
  int nFans1;
  int nFans0;
  int iLit1;
  int iLit0;
  int i;
  uint *pCofs4 [2] [2];
  uint *pCofs2 [2];
  uint *pTruth;
  int nWords;
  Kit_DsdObj_t *pRes1;
  Kit_DsdObj_t *pRes0;
  Kit_DsdObj_t *pRes;
  int nDecMux_local;
  unsigned_short *pPar_local;
  uint uSupp_local;
  Kit_DsdObj_t *pObj_local;
  Kit_DsdNtk_t *pNtk_local;
  
  iVar4 = Kit_TruthWordNum((uint)*pObj >> 0x1a);
  pTruth_00 = Kit_DsdObjTruth(pObj);
  puVar16 = pNtk->pMem;
  pCof1 = pNtk->pMem + iVar4;
  puVar15 = pNtk->pMem + (iVar4 << 1);
  pOut = pNtk->pMem + iVar4 * 3;
  pOut_00 = pNtk->pMem + (iVar4 << 2);
  pOut_01 = pNtk->pMem + iVar4 * 5;
  if ((uint)*pObj >> 0x1a == 0) {
    __assert_fail("pObj->nFans > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x7be,
                  "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                 );
  }
  if (((uint)*pObj >> 6 & 7) != 5) {
    __assert_fail("pObj->Type == KIT_DSD_PRIME",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x7bf,
                  "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                 );
  }
  uVar5 = Kit_TruthSupport(pTruth_00,(uint)*pObj >> 0x1a);
  if (uSupp != uVar5) {
    __assert_fail("uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans))",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x7c0,
                  "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                 );
  }
  uVar5 = Kit_BitMask((uint)*pObj >> 0x1a);
  pPar_local._4_4_ = uSupp;
  if (uSupp != uVar5) {
    uVar5 = Kit_WordCountOnes(uSupp);
    Kit_TruthShrink(pNtk->pMem,pTruth_00,uVar5,(uint)*pObj >> 0x1a,uSupp,1);
    uSupp0 = 0;
    for (nFansNew = 0; nFansNew < (uint)*pObj >> 0x1a; nFansNew = nFansNew + 1) {
      if ((uSupp & 1 << ((byte)nFansNew & 0x1f)) != 0) {
        *(undefined2 *)(&pObj[1].field_0x0 + (ulong)uSupp0 * 2) =
             *(undefined2 *)(&pObj[1].field_0x0 + (ulong)nFansNew * 2);
        uSupp0 = uSupp0 + 1;
      }
    }
    if (uSupp0 != uVar5) {
      __assert_fail("k == nFansNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7ca,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    *pObj = (Kit_DsdObj_t)((uint)*pObj & 0x3ffffff | uSupp0 << 0x1a);
    pPar_local._4_4_ = Kit_BitMask((uint)*pObj >> 0x1a);
  }
  if ((uint)*pObj >> 0x1a == 1) {
    *pObj = (Kit_DsdObj_t)((uint)*pObj & 0xfffffe3f);
    if (*pTruth_00 == 0x55555555) {
      iVar4 = Abc_LitNot((uint)*(ushort *)(pObj + 1));
      *(short *)(pObj + 1) = (short)iVar4;
    }
    else if (*pTruth_00 != 0xaaaaaaaa) {
      __assert_fail("pTruth[0] == 0xAAAAAAAA",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7d6,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    uVar1 = *(ushort *)(pObj + 1);
    iVar4 = Abc_LitIsCompl((uint)*pPar);
    iVar4 = Abc_LitNotCond((uint)uVar1,iVar4);
    *pPar = (unsigned_short)iVar4;
  }
  else if (((uint)*pObj >> 9 & 1) == 0) {
    iLit1 = (uint)*pObj >> 0x1a;
    do {
      iLit1 = iLit1 - 1;
      if (iLit1 < 0) goto LAB_006f134c;
      Kit_TruthCofactor0New(puVar16,pTruth_00,(uint)*pObj >> 0x1a,iLit1);
      Kit_TruthCofactor1New(pCof1,pTruth_00,(uint)*pObj >> 0x1a,iLit1);
      iVar4 = Kit_TruthIsConst0(puVar16,(uint)*pObj >> 0x1a);
      iVar6 = Kit_TruthIsConst0(pCof1,(uint)*pObj >> 0x1a);
      iVar7 = Kit_TruthIsConst1(puVar16,(uint)*pObj >> 0x1a);
      iVar8 = Kit_TruthIsConst1(pCof1,(uint)*pObj >> 0x1a);
      iVar9 = Kit_TruthIsOpposite(puVar16,pCof1,(uint)*pObj >> 0x1a);
      iVar10 = Kit_TruthIsEqual(puVar16,pCof1,(uint)*pObj >> 0x1a);
      if (iVar10 != 0) {
        __assert_fail("!Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x7eb,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      if (iVar4 + iVar6 + iVar7 + iVar8 + iVar9 != 0) {
        pKVar13 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
        *pKVar13 = (Kit_DsdObj_t)
                   ((uint)*pKVar13 & 0xfc03ffff |
                   (((uint)*pKVar13 >> 0x12 & 0xff) + 1 & 0xff) << 0x12);
        *pKVar13 = (Kit_DsdObj_t)((uint)*pKVar13 & 0x3ffffff | 0x8000000);
        *(undefined2 *)(pKVar13 + 1) = *(undefined2 *)(&pObj[1].field_0x0 + (long)iLit1 * 2);
        *(undefined2 *)(&pObj[1].field_0x0 + (long)iLit1 * 2) = 0x7f;
        *(short *)&pKVar13[1].field_0x2 = (short)(((uint)*pObj & 0x3f) << 1);
        KVar3 = *pKVar13;
        iVar10 = Abc_LitIsCompl((uint)*pPar);
        iVar10 = Abc_LitNotCond(((uint)KVar3 & 0x3f) << 1,iVar10);
        *pPar = (unsigned_short)iVar10;
        if (iVar4 == 0) {
          if (iVar6 == 0) {
            if (iVar7 == 0) {
              if (iVar8 == 0) {
                if (iVar9 == 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                                ,0x830,
                                "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                               );
                }
                *pKVar13 = (Kit_DsdObj_t)((uint)*pKVar13 & 0xfffffe3f | 0x100);
                Kit_TruthCopy(pTruth_00,puVar16,(uint)*pObj >> 0x1a);
              }
              else {
                iVar4 = Abc_LitNot((uint)*pPar);
                *pPar = (unsigned_short)iVar4;
                iVar4 = Abc_LitNot((uint)*(ushort *)(pKVar13 + 1));
                *(short *)(pKVar13 + 1) = (short)iVar4;
                iVar4 = Abc_LitNot((uint)*(ushort *)&pKVar13[1].field_0x2);
                *(short *)&pKVar13[1].field_0x2 = (short)iVar4;
                Kit_TruthCopy(pTruth_00,puVar16,(uint)*pObj >> 0x1a);
              }
            }
            else {
              iVar4 = Abc_LitNot((uint)*pPar);
              *pPar = (unsigned_short)iVar4;
              iVar4 = Abc_LitNot((uint)*(ushort *)&pKVar13[1].field_0x2);
              *(short *)&pKVar13[1].field_0x2 = (short)iVar4;
              Kit_TruthCopy(pTruth_00,pCof1,(uint)*pObj >> 0x1a);
            }
          }
          else {
            iVar4 = Abc_LitNot((uint)*(ushort *)(pKVar13 + 1));
            *(short *)(pKVar13 + 1) = (short)iVar4;
            Kit_TruthCopy(pTruth_00,puVar16,(uint)*pObj >> 0x1a);
          }
        }
        else {
          Kit_TruthCopy(pTruth_00,pCof1,(uint)*pObj >> 0x1a);
        }
        puVar16 = Kit_DsdObjTruth(pObj);
        if (puVar16 == pTruth_00) {
          Kit_DsdDecompose_rec
                    (pNtk,pObj,(1 << ((byte)iLit1 & 0x1f) ^ 0xffffffffU) & pPar_local._4_4_,
                     (unsigned_short *)&pKVar13[1].field_0x2,nDecMux);
          return;
        }
        __assert_fail("Kit_DsdObjTruth(pObj) == pTruth",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x832,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      uVar5 = Kit_TruthSupport(puVar16,(uint)*pObj >> 0x1a);
      uVar11 = Kit_TruthSupport(pCof1,(uint)*pObj >> 0x1a);
      if (pPar_local._4_4_ != (uVar5 | uVar11 | 1 << ((byte)iLit1 & 0x1f))) {
        __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x7f1,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
    } while ((uVar5 & uVar11) != 0);
    pKVar13 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
    pKVar14 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
    for (uSupp0 = 0; uSupp0 < (uint)*pObj >> 0x1a; uSupp0 = uSupp0 + 1) {
      if ((uVar5 & 1 << ((byte)uSupp0 & 0x1f)) == 0) {
        uVar2 = 0x7f;
      }
      else {
        uVar2 = *(undefined2 *)(&pObj[1].field_0x0 + (ulong)uSupp0 * 2);
      }
      *(undefined2 *)(&pKVar13[1].field_0x0 + (ulong)uSupp0 * 2) = uVar2;
      if ((uVar11 & 1 << ((byte)uSupp0 & 0x1f)) == 0) {
        uVar2 = 0x7f;
      }
      else {
        uVar2 = *(undefined2 *)(&pObj[1].field_0x0 + (ulong)uSupp0 * 2);
      }
      *(undefined2 *)(&pKVar14[1].field_0x0 + (ulong)uSupp0 * 2) = uVar2;
    }
    puVar15 = Kit_DsdObjTruth(pKVar13);
    Kit_TruthCopy(puVar15,puVar16,(uint)*pObj >> 0x1a);
    puVar16 = Kit_DsdObjTruth(pKVar14);
    Kit_TruthCopy(puVar16,pCof1,(uint)*pObj >> 0x1a);
    if (((uint)*pObj >> 6 & 7) != 5) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7ff,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    *pTruth_00 = 0xcacacaca;
    *pObj = (Kit_DsdObj_t)((uint)*pObj & 0x3ffffff | 0xc000000);
    *(undefined2 *)(pObj + 2) = *(undefined2 *)(&pObj[1].field_0x0 + (long)iLit1 * 2);
    *(short *)(pObj + 1) = (short)(((uint)*pKVar13 & 0x3f) << 1);
    *pKVar13 = (Kit_DsdObj_t)
               ((uint)*pKVar13 & 0xfc03ffff | (((uint)*pKVar13 >> 0x12 & 0xff) + 1 & 0xff) << 0x12);
    *(short *)&pObj[1].field_0x2 = (short)(((uint)*pKVar14 & 0x3f) << 1);
    *pKVar14 = (Kit_DsdObj_t)
               ((uint)*pKVar14 & 0xfc03ffff | (((uint)*pKVar14 >> 0x12 & 0xff) + 1 & 0xff) << 0x12);
    Kit_DsdDecompose_rec(pNtk,pKVar13,uVar5,(unsigned_short *)(pObj + 1),nDecMux);
    Kit_DsdDecompose_rec(pNtk,pKVar14,uVar11,(unsigned_short *)&pObj[1].field_0x2,nDecMux);
  }
  else {
LAB_006f134c:
    *pObj = (Kit_DsdObj_t)((uint)*pObj & 0xfffffdff | 0x200);
    uVar5 = (uint)*pObj >> 0x1a;
    while (uSupp0 = uVar5, iLit1 = uSupp0 - 1, -1 < iLit1) {
      iVar4 = Kit_TruthVarInSupport(pTruth_00,(uint)*pObj >> 0x1a,iLit1);
      if (iVar4 == 0) {
        __assert_fail("Kit_TruthVarInSupport( pTruth, pObj->nFans, i )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x83b,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      Kit_TruthCofactor0New(puVar16,pTruth_00,(uint)*pObj >> 0x1a,iLit1);
      Kit_TruthCofactor1New(pCof1,pTruth_00,(uint)*pObj >> 0x1a,iLit1);
      uVar5 = Kit_TruthSupport(puVar16,(uint)*pObj >> 0x1a);
      uVar11 = Kit_TruthSupport(pCof1,(uint)*pObj >> 0x1a);
      if (pPar_local._4_4_ != (uVar5 | uVar11 | 1 << ((byte)iLit1 & 0x1f))) {
        __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x842,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      if ((uVar5 == 0) || (uVar11 == 0)) {
        *pObj = (Kit_DsdObj_t)((uint)*pObj & 0xfffffdff);
        Kit_DsdDecompose_rec(pNtk,pObj,pPar_local._4_4_,pPar,nDecMux);
        return;
      }
      if ((uVar5 == 0) || (uVar11 == 0)) {
        __assert_fail("uSupp0 && uSupp1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x84a,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      iVar4 = Kit_WordCountOnes(uVar5 & (uVar11 ^ 0xffffffff));
      iVar6 = Kit_WordCountOnes(uVar11 & (uVar5 ^ 0xffffffff));
      if ((iVar4 == 1) && (iVar6 == 1)) {
        iVar4 = Kit_WordFindFirstBit(uVar5 & (uVar11 ^ 0xffffffff));
        iVar6 = Kit_WordFindFirstBit(uVar11 & (uVar5 ^ 0xffffffff));
        Kit_TruthCofactor0New(puVar15,puVar16,(uint)*pObj >> 0x1a,iVar4);
        Kit_TruthCofactor1New(pOut,puVar16,(uint)*pObj >> 0x1a,iVar4);
        Kit_TruthCofactor0New(pOut_00,pCof1,(uint)*pObj >> 0x1a,iVar6);
        Kit_TruthCofactor1New(pOut_01,pCof1,(uint)*pObj >> 0x1a,iVar6);
        iVar7 = Kit_TruthIsEqual(puVar15,pOut_00,(uint)*pObj >> 0x1a);
        iVar8 = Kit_TruthIsEqual(pOut,pOut_01,(uint)*pObj >> 0x1a);
        iVar9 = Kit_TruthIsEqual(puVar15,pOut_01,(uint)*pObj >> 0x1a);
        iVar10 = Kit_TruthIsEqual(pOut,pOut_00,(uint)*pObj >> 0x1a);
        if (((iVar7 != 0) && (iVar8 != 0)) || ((iVar9 != 0 && (iVar10 != 0)))) {
          pKVar13 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,3);
          puVar16 = Kit_DsdObjTruth(pKVar13);
          *puVar16 = 0xcacacaca;
          *pKVar13 = (Kit_DsdObj_t)
                     ((uint)*pKVar13 & 0xfc03ffff |
                     (((uint)*pKVar13 >> 0x12 & 0xff) + 1 & 0xff) << 0x12);
          *pKVar13 = (Kit_DsdObj_t)((uint)*pKVar13 & 0x3ffffff | 0xc000000);
          *(undefined2 *)(pKVar13 + 1) = *(undefined2 *)(&pObj[1].field_0x0 + (long)iVar4 * 2);
          *(undefined2 *)(&pObj[1].field_0x0 + (long)iVar4 * 2) = 0x7f;
          *(undefined2 *)&pKVar13[1].field_0x2 =
               *(undefined2 *)(&pObj[1].field_0x0 + (long)iVar6 * 2);
          *(undefined2 *)(&pObj[1].field_0x0 + (long)iVar6 * 2) = 0x7f;
          *(undefined2 *)(pKVar13 + 2) = *(undefined2 *)(&pObj[1].field_0x0 + (long)iLit1 * 2);
          *(short *)(&pObj[1].field_0x0 + (long)iLit1 * 2) = (short)(((uint)*pKVar13 & 0x3f) << 1);
          Kit_TruthMuxVar(pTruth_00,pOut_00,pOut_01,(uint)*pObj >> 0x1a,iLit1);
          if ((iVar9 != 0) && (iVar10 != 0)) {
            iVar7 = Abc_LitNot((uint)*(ushort *)(pKVar13 + 1));
            *(short *)(pKVar13 + 1) = (short)iVar7;
          }
          Kit_DsdDecompose_rec
                    (pNtk,pObj,
                     (1 << ((byte)iVar6 & 0x1f) ^ 0xffffffffU) &
                     (1 << ((byte)iVar4 & 0x1f) ^ 0xffffffffU) & pPar_local._4_4_,pPar,nDecMux);
          return;
        }
      }
      for (; uVar5 = iLit1, uSupp0 < (uint)*pObj >> 0x1a; uSupp0 = uSupp0 + 1) {
        Kit_TruthCofactor0New(puVar15,puVar16,(uint)*pObj >> 0x1a,uSupp0);
        Kit_TruthCofactor1New(pOut,puVar16,(uint)*pObj >> 0x1a,uSupp0);
        Kit_TruthCofactor0New(pOut_00,pCof1,(uint)*pObj >> 0x1a,uSupp0);
        Kit_TruthCofactor1New(pOut_01,pCof1,(uint)*pObj >> 0x1a,uSupp0);
        iVar4 = Kit_TruthIsEqual(puVar15,pOut,(uint)*pObj >> 0x1a);
        iVar6 = Kit_TruthIsEqual(puVar15,pOut_00,(uint)*pObj >> 0x1a);
        iVar7 = Kit_TruthIsEqual(puVar15,pOut_01,(uint)*pObj >> 0x1a);
        iVar8 = Kit_TruthIsEqual(pOut,pOut_00,(uint)*pObj >> 0x1a);
        iVar9 = Kit_TruthIsEqual(pOut,pOut_01,(uint)*pObj >> 0x1a);
        iVar10 = Kit_TruthIsEqual(pOut_00,pOut_01,(uint)*pObj >> 0x1a);
        iVar12 = iVar4 + iVar6 + iVar7 + iVar8 + iVar9 + iVar10;
        if ((iVar12 == 3) || (iVar12 == 2)) {
          pKVar13 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
          *pKVar13 = (Kit_DsdObj_t)
                     ((uint)*pKVar13 & 0xfc03ffff |
                     (((uint)*pKVar13 >> 0x12 & 0xff) + 1 & 0xff) << 0x12);
          *pKVar13 = (Kit_DsdObj_t)((uint)*pKVar13 & 0x3ffffff | 0x8000000);
          *(undefined2 *)(pKVar13 + 1) = *(undefined2 *)(&pObj[1].field_0x0 + (ulong)uSupp0 * 2);
          *(short *)(&pObj[1].field_0x0 + (ulong)uSupp0 * 2) = (short)(((uint)*pKVar13 & 0x3f) << 1)
          ;
          *(undefined2 *)&pKVar13[1].field_0x2 =
               *(undefined2 *)(&pObj[1].field_0x0 + (long)iLit1 * 2);
          *(undefined2 *)(&pObj[1].field_0x0 + (long)iLit1 * 2) = 0x7f;
          if ((iVar4 == 0) && ((iVar6 == 0 && (iVar7 == 0)))) {
            iVar4 = Abc_LitNot((uint)*(ushort *)(pKVar13 + 1));
            *(short *)(pKVar13 + 1) = (short)iVar4;
            iVar4 = Abc_LitNot((uint)*(ushort *)&pKVar13[1].field_0x2);
            *(short *)&pKVar13[1].field_0x2 = (short)iVar4;
            Kit_TruthMuxVar(pTruth_00,pOut_01,puVar15,(uint)*pObj >> 0x1a,uSupp0);
          }
          else if ((iVar4 == 0) && ((iVar8 == 0 && (iVar9 == 0)))) {
            iVar4 = Abc_LitNot((uint)*(ushort *)&pKVar13[1].field_0x2);
            *(short *)&pKVar13[1].field_0x2 = (short)iVar4;
            Kit_TruthMuxVar(pTruth_00,puVar15,pOut,(uint)*pObj >> 0x1a,uSupp0);
          }
          else if ((iVar6 == 0) && ((iVar8 == 0 && (iVar10 == 0)))) {
            iVar4 = Abc_LitNot((uint)*(ushort *)(pKVar13 + 1));
            *(short *)(pKVar13 + 1) = (short)iVar4;
            Kit_TruthMuxVar(pTruth_00,puVar15,pOut_00,(uint)*pObj >> 0x1a,uSupp0);
          }
          else if ((iVar7 == 0) && ((iVar9 == 0 && (iVar10 == 0)))) {
            Kit_TruthMuxVar(pTruth_00,puVar15,pOut_01,(uint)*pObj >> 0x1a,uSupp0);
          }
          else {
            if ((iVar7 == 0) || (iVar8 == 0)) {
              __assert_fail("fPairs[0][3] && fPairs[1][2]",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                            ,0x8ab,
                            "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                           );
            }
            *pKVar13 = (Kit_DsdObj_t)((uint)*pKVar13 & 0xfffffe3f | 0x100);
            Kit_TruthMuxVar(pTruth_00,puVar15,pOut,(uint)*pObj >> 0x1a,uSupp0);
          }
          Kit_DsdDecompose_rec
                    (pNtk,pObj,(1 << ((byte)iLit1 & 0x1f) ^ 0xffffffffU) & pPar_local._4_4_,pPar,
                     nDecMux);
          return;
        }
      }
    }
    if ((0 < nDecMux) && (nDecMux < (int)((uint)*pObj >> 0x1a))) {
      iVar4 = Kit_TruthBestCofVar(pTruth_00,(uint)*pObj >> 0x1a,puVar16,pCof1);
      uVar5 = Kit_TruthSupport(puVar16,(uint)*pObj >> 0x1a);
      uVar11 = Kit_TruthSupport(pCof1,(uint)*pObj >> 0x1a);
      pKVar13 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      pKVar14 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      for (uSupp0 = 0; uSupp0 < (uint)*pObj >> 0x1a; uSupp0 = uSupp0 + 1) {
        uVar2 = *(undefined2 *)(&pObj[1].field_0x0 + (ulong)uSupp0 * 2);
        *(undefined2 *)(&pKVar14[1].field_0x0 + (ulong)uSupp0 * 2) = uVar2;
        *(undefined2 *)(&pKVar13[1].field_0x0 + (ulong)uSupp0 * 2) = uVar2;
      }
      puVar15 = Kit_DsdObjTruth(pKVar13);
      Kit_TruthCopy(puVar15,puVar16,(uint)*pObj >> 0x1a);
      puVar16 = Kit_DsdObjTruth(pKVar14);
      Kit_TruthCopy(puVar16,pCof1,(uint)*pObj >> 0x1a);
      if (((uint)*pObj >> 6 & 7) != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x8c3,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pTruth_00 = 0xcacacaca;
      *pObj = (Kit_DsdObj_t)((uint)*pObj & 0x3ffffff | 0xc000000);
      *(undefined2 *)(pObj + 2) = *(undefined2 *)(&pObj[1].field_0x0 + (long)iVar4 * 2);
      *(short *)(pObj + 1) = (short)(((uint)*pKVar13 & 0x3f) << 1);
      *pKVar13 = (Kit_DsdObj_t)
                 ((uint)*pKVar13 & 0xfc03ffff | (((uint)*pKVar13 >> 0x12 & 0xff) + 1 & 0xff) << 0x12
                 );
      *(short *)&pObj[1].field_0x2 = (short)(((uint)*pKVar14 & 0x3f) << 1);
      *pKVar14 = (Kit_DsdObj_t)
                 ((uint)*pKVar14 & 0xfc03ffff | (((uint)*pKVar14 >> 0x12 & 0xff) + 1 & 0xff) << 0x12
                 );
      Kit_DsdDecompose_rec(pNtk,pKVar13,uVar5,(unsigned_short *)(pObj + 1),nDecMux);
      Kit_DsdDecompose_rec(pNtk,pKVar14,uVar11,(unsigned_short *)&pObj[1].field_0x2,nDecMux);
    }
  }
  return;
}

Assistant:

void Kit_DsdDecompose_rec( Kit_DsdNtk_t * pNtk, Kit_DsdObj_t * pObj, unsigned uSupp, unsigned short * pPar, int nDecMux )
{
    Kit_DsdObj_t * pRes, * pRes0, * pRes1;
    int nWords = Kit_TruthWordNum(pObj->nFans);
    unsigned * pTruth = Kit_DsdObjTruth(pObj);
    unsigned * pCofs2[2] = { pNtk->pMem, pNtk->pMem + nWords };
    unsigned * pCofs4[2][2] = { {pNtk->pMem + 2 * nWords, pNtk->pMem + 3 * nWords}, {pNtk->pMem + 4 * nWords, pNtk->pMem + 5 * nWords} };
    int i, iLit0, iLit1, nFans0, nFans1, nPairs;
    int fEquals[2][2], fOppos, fPairs[4][4];
    unsigned j, k, nFansNew, uSupp0, uSupp1;

    assert( pObj->nFans > 0 );
    assert( pObj->Type == KIT_DSD_PRIME );
    assert( uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans)) );

    // compress the truth table
    if ( uSupp != Kit_BitMask(pObj->nFans) )
    {
        nFansNew = Kit_WordCountOnes(uSupp);
        Kit_TruthShrink( pNtk->pMem, pTruth, nFansNew, pObj->nFans, uSupp, 1 );
        for ( j = k = 0; j < pObj->nFans; j++ )
            if ( uSupp & (1 << j) )
                pObj->pFans[k++] = pObj->pFans[j];
        assert( k == nFansNew );
        pObj->nFans = k;
        uSupp = Kit_BitMask(pObj->nFans);
    }

    // consider the single variable case
    if ( pObj->nFans == 1 )
    {
        pObj->Type = KIT_DSD_NONE;
        if ( pTruth[0] == 0x55555555 )
            pObj->pFans[0] = Abc_LitNot(pObj->pFans[0]);
        else
            assert( pTruth[0] == 0xAAAAAAAA );
        // update the parent pointer
        *pPar = Abc_LitNotCond( pObj->pFans[0], Abc_LitIsCompl(*pPar) );
        return;
    }

    // decompose the output
    if ( !pObj->fMark )
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        // get the two-variable cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
//        assert( !Kit_TruthVarInSupport( pCofs2[0], pObj->nFans, i) );
//        assert( !Kit_TruthVarInSupport( pCofs2[1], pObj->nFans, i) );
        // get the constant cofs
        fEquals[0][0] = Kit_TruthIsConst0( pCofs2[0], pObj->nFans );
        fEquals[0][1] = Kit_TruthIsConst0( pCofs2[1], pObj->nFans );
        fEquals[1][0] = Kit_TruthIsConst1( pCofs2[0], pObj->nFans );
        fEquals[1][1] = Kit_TruthIsConst1( pCofs2[1], pObj->nFans );
        fOppos        = Kit_TruthIsOpposite( pCofs2[0], pCofs2[1], pObj->nFans );
        assert( !Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans) );
        if ( fEquals[0][0] + fEquals[0][1] + fEquals[1][0] + fEquals[1][1] + fOppos == 0 )
        {
            // check the MUX decomposition
            uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
            uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
            assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
            if ( uSupp0 & uSupp1 )
                continue;
            // perform MUX decomposition
            pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            for ( k = 0; k < pObj->nFans; k++ )
            {
                pRes0->pFans[k] = (uSupp0 & (1 << k))? pObj->pFans[k] : 127;
                pRes1->pFans[k] = (uSupp1 & (1 << k))? pObj->pFans[k] : 127;
            }
            Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
            Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
            // update the current one
            assert( pObj->Type == KIT_DSD_PRIME );
            pTruth[0] = 0xCACACACA;
            pObj->nFans = 3;
            pObj->pFans[2] = pObj->pFans[i];
            pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
            pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
            // call recursively
            Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
            Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
            return;
        }

        // create the new node
        pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
        pRes->nRefs++;
        pRes->nFans = 2;
        pRes->pFans[0] = pObj->pFans[i];  pObj->pFans[i] = 127;  uSupp &= ~(1 << i);
        pRes->pFans[1] = 2*pObj->Id;
        // update the parent pointer
        *pPar = Abc_LitNotCond( 2 * pRes->Id, Abc_LitIsCompl(*pPar) );
        // consider different decompositions
        if ( fEquals[0][0] )
        {
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[0][1] )
        {
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fEquals[1][0] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[1][1] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fOppos )
        {
            pRes->Type = KIT_DSD_XOR;
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else
            assert( 0 );
        // decompose the remainder
        assert( Kit_DsdObjTruth(pObj) == pTruth );
        Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pRes->pFans + 1, nDecMux );
        return;
    }
    pObj->fMark = 1;

    // decompose the input
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        assert( Kit_TruthVarInSupport( pTruth, pObj->nFans, i ) );
        // get the single variale cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
        // check the existence of MUX decomposition
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
        // if one of the cofs is a constant, it is time to check the output again
        if ( uSupp0 == 0 || uSupp1 == 0 )
        {
            pObj->fMark = 0;
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
        assert( uSupp0 && uSupp1 );
        // get the number of unique variables
        nFans0 = Kit_WordCountOnes( uSupp0 & ~uSupp1 );
        nFans1 = Kit_WordCountOnes( uSupp1 & ~uSupp0 );
        if ( nFans0 == 1 && nFans1 == 1 )
        {
            // get the cofactors w.r.t. the unique variables
            iLit0 = Kit_WordFindFirstBit( uSupp0 & ~uSupp1 );
            iLit1 = Kit_WordFindFirstBit( uSupp1 & ~uSupp0 );
            // get four cofactors                                        
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, iLit1 );
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, iLit1 );
            // check existence conditions
            fEquals[0][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fEquals[0][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fEquals[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fEquals[1][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            if ( (fEquals[0][0] && fEquals[0][1]) || (fEquals[1][0] && fEquals[1][1]) )
            {
                // construct the MUX
                pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, 3 );
                Kit_DsdObjTruth(pRes)[0] = 0xCACACACA;
                pRes->nRefs++;
                pRes->nFans = 3;
                pRes->pFans[0] = pObj->pFans[iLit0]; pObj->pFans[iLit0] = 127;  uSupp &= ~(1 << iLit0);
                pRes->pFans[1] = pObj->pFans[iLit1]; pObj->pFans[iLit1] = 127;  uSupp &= ~(1 << iLit1);
                pRes->pFans[2] = pObj->pFans[i];     pObj->pFans[i] = 2 * pRes->Id; // remains in support
                // update the node
//                if ( fEquals[0][0] && fEquals[0][1] )
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, i );
//                else
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][1], pCofs4[0][0], pObj->nFans, i );
                Kit_TruthMuxVar( pTruth, pCofs4[1][0], pCofs4[1][1], pObj->nFans, i );
                if ( fEquals[1][0] && fEquals[1][1] )
                    pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
                // decompose the remainder
                Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
                return;
            }
        }

        // try other inputs
        for ( k = i+1; k < pObj->nFans; k++ )
        {
            // get four cofactors                                                ik
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, k ); // 00 
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, k ); // 01 
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, k ); // 10 
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, k ); // 11 
            // compare equal pairs
            fPairs[0][1] = fPairs[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[0][1], pObj->nFans );
            fPairs[0][2] = fPairs[2][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fPairs[0][3] = fPairs[3][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fPairs[1][2] = fPairs[2][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            fPairs[1][3] = fPairs[3][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fPairs[2][3] = fPairs[3][2] = Kit_TruthIsEqual( pCofs4[1][0], pCofs4[1][1], pObj->nFans );
            nPairs = fPairs[0][1] + fPairs[0][2] + fPairs[0][3] + fPairs[1][2] + fPairs[1][3] + fPairs[2][3];
            if ( nPairs != 3 && nPairs != 2 )
                continue;

            // decomposition exists
            pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
            pRes->nRefs++;
            pRes->nFans = 2;
            pRes->pFans[0] = pObj->pFans[k]; pObj->pFans[k] = 2 * pRes->Id;  // remains in support
            pRes->pFans[1] = pObj->pFans[i]; pObj->pFans[i] = 127;       uSupp &= ~(1 << i);
            if ( !fPairs[0][1] && !fPairs[0][2] && !fPairs[0][3] ) // 00
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
                Kit_TruthMuxVar( pTruth, pCofs4[1][1], pCofs4[0][0], pObj->nFans, k );
            }
            else if ( !fPairs[1][0] && !fPairs[1][2] && !fPairs[1][3] ) // 01
            {
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            else if ( !fPairs[2][0] && !fPairs[2][1] && !fPairs[2][3] ) // 10
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][0], pObj->nFans, k );
            }
            else if ( !fPairs[3][0] && !fPairs[3][1] && !fPairs[3][2] ) // 11
            {
//                unsigned uSupp0 = Kit_TruthSupport(pCofs4[0][0], pObj->nFans);
//                unsigned uSupp1 = Kit_TruthSupport(pCofs4[1][1], pObj->nFans);
//                unsigned uSupp;
//                Extra_PrintBinary( stdout, &uSupp0, pObj->nFans ); printf( "\n" );
//                Extra_PrintBinary( stdout, &uSupp1, pObj->nFans ); printf( "\n" );
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][1], pObj->nFans, k );
//                uSupp = Kit_TruthSupport(pTruth, pObj->nFans);
//                Extra_PrintBinary( stdout, &uSupp, pObj->nFans ); printf( "\n" ); printf( "\n" );
            }
            else
            {
                assert( fPairs[0][3] && fPairs[1][2] );
                pRes->Type = KIT_DSD_XOR;;
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            // decompose the remainder
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
    }

    // if all decomposition methods failed and we are still above the limit, perform MUX-decomposition
    if ( nDecMux > 0 && (int)pObj->nFans > nDecMux )
    {
        int iBestVar = Kit_TruthBestCofVar( pTruth, pObj->nFans, pCofs2[0], pCofs2[1] );
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        // perform MUX decomposition
        pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        for ( k = 0; k < pObj->nFans; k++ )
            pRes0->pFans[k] = pRes1->pFans[k] = pObj->pFans[k];
        Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
        Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
        // update the current one
        assert( pObj->Type == KIT_DSD_PRIME );
        pTruth[0] = 0xCACACACA;
        pObj->nFans = 3;
        pObj->pFans[2] = pObj->pFans[iBestVar];
        pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
        pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
        // call recursively
        Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
        Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
    }

}